

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O0

void __thiscall Assimp::MD5Importer::LoadMD5CameraFile(MD5Importer *this)

{
  uint uVar1;
  uint uVar2;
  IOSystem *this_00;
  float fVar3;
  vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
  *pvVar4;
  bool bVar5;
  int iVar6;
  ai_uint32 aVar7;
  IOStream *__p;
  pointer pIVar8;
  undefined4 extraout_var;
  DeadlyImportError *pDVar9;
  aiNode *paVar10;
  aiNode **ppaVar11;
  aiCamera **ppaVar12;
  aiCamera *this_01;
  reference pvVar13;
  size_type sVar14;
  reference pvVar15;
  aiAnimation *this_02;
  ulong uVar16;
  reference puVar17;
  aiNodeAnim **ppaVar18;
  aiNodeAnim *this_03;
  aiVectorKey *paVar19;
  aiQuatKey *paVar20;
  aiQuatKey *local_340;
  aiVectorKey *local_318;
  uint local_214;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Stack_210;
  uint i;
  aiNodeAnim *local_208;
  aiNodeAnim *nd;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1f8;
  aiAnimation *local_1f0;
  aiAnimation *anim;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1e0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1d8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1d0;
  const_iterator it;
  aiAnimation **tmp;
  uint *local_1b8;
  value_type_conflict1 local_1ac;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1a8;
  const_iterator local_1a0;
  value_type_conflict1 local_198 [2];
  aiCamera *local_190;
  aiCamera *cam;
  string local_180;
  undefined1 local_15a;
  allocator<char> local_159;
  string local_158;
  aiNode *local_138;
  aiNode *root;
  vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
  *frames;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *cuts;
  string local_118;
  undefined1 local_f8 [8];
  MD5CameraParser cameraParser;
  MD5Parser parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_59;
  string local_58;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_38;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  string pFile;
  MD5Importer *this_local;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 &this->mFile,"md5camera");
  this_00 = this->pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"rb",&local_59);
  __p = IOSystem::Open(this_00,(string *)&file,&local_58);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_38,__p);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  pIVar8 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_38)
  ;
  if (pIVar8 != (pointer)0x0) {
    pIVar8 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_38);
    iVar6 = (*pIVar8->_vptr_IOStream[6])();
    if (CONCAT44(extraout_var,iVar6) != 0) {
      this->bHadMD5Camera = true;
      pIVar8 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                         (&local_38);
      LoadFileIntoMemory(this,pIVar8);
      MD5::MD5Parser::MD5Parser
                ((MD5Parser *)
                 &cameraParser.frames.
                  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,this->mBuffer,this->fileSize);
      MD5::MD5CameraParser::MD5CameraParser
                ((MD5CameraParser *)local_f8,
                 (SectionList *)
                 &cameraParser.frames.
                  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar5 = std::
              vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
              ::empty((vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                       *)&cameraParser.cuts.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      if (bVar5) {
        cuts._6_1_ = 1;
        pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"MD5CAMERA: No frames parsed",
                   (allocator<char> *)((long)&cuts + 7));
        DeadlyImportError::DeadlyImportError(pDVar9,&local_118);
        cuts._6_1_ = 0;
        __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      frames = (vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                *)&cameraParser;
      root = (aiNode *)
             &cameraParser.cuts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
      paVar10 = (aiNode *)operator_new(0x478);
      local_15a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"<MD5CameraRoot>",&local_159);
      aiNode::aiNode(paVar10,&local_158);
      local_15a = 0;
      this->pScene->mRootNode = paVar10;
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
      paVar10->mNumChildren = 1;
      local_138 = paVar10;
      ppaVar11 = (aiNode **)operator_new__(8);
      local_138->mChildren = ppaVar11;
      paVar10 = (aiNode *)operator_new(0x478);
      cam._6_1_ = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"<MD5Camera>",(allocator<char> *)((long)&cam + 7));
      aiNode::aiNode(paVar10,&local_180);
      cam._6_1_ = 0;
      *local_138->mChildren = paVar10;
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cam + 7));
      (*local_138->mChildren)->mParent = local_138;
      this->pScene->mNumCameras = 1;
      ppaVar12 = (aiCamera **)operator_new__(8);
      this->pScene->mCameras = ppaVar12;
      this_01 = (aiCamera *)operator_new(0x438);
      aiCamera::aiCamera(this_01);
      *this->pScene->mCameras = this_01;
      local_190 = this_01;
      aiString::operator=((aiString *)this_01,"<MD5Camera>");
      pvVar13 = std::
                vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                ::front((vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                         *)root);
      local_190->mHorizontalFOV = pvVar13->fFOV * 0.017453292;
      sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)frames);
      pvVar4 = frames;
      if (sVar14 == 0) {
        local_198[1] = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)frames,local_198 + 1);
        pvVar4 = frames;
        sVar14 = std::
                 vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                 ::size((vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                         *)root);
        local_198[0] = (int)sVar14 - 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar4,local_198);
      }
      else {
        local_1a8._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)frames);
        __gnu_cxx::
        __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
        ::__normal_iterator<unsigned_int*>
                  ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    *)&local_1a0,&local_1a8);
        local_1ac = 0;
        local_1b8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::insert
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar4
                                       ,local_1a0,&local_1ac);
        pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)frames);
        uVar1 = *pvVar15;
        sVar14 = std::
                 vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                 ::size((vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                         *)root);
        pvVar4 = frames;
        if ((ulong)uVar1 < sVar14 - 1) {
          sVar14 = std::
                   vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                   ::size((vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                           *)root);
          tmp._4_4_ = (int)sVar14 + -1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar4,
                     (value_type_conflict1 *)((long)&tmp + 4));
        }
      }
      sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)frames);
      this->pScene->mNumAnimations = (int)sVar14 - 1;
      it._M_current = (uint *)operator_new__((ulong)this->pScene->mNumAnimations << 3);
      this->pScene->mAnimations = (aiAnimation **)it._M_current;
      local_1d8._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)frames);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  *)&local_1d0,&local_1d8);
      while( true ) {
        anim = (aiAnimation *)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)frames);
        local_1e0 = __gnu_cxx::
                    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator-((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)&anim,1);
        bVar5 = __gnu_cxx::operator!=(&local_1d0,&local_1e0);
        if (!bVar5) break;
        this_02 = (aiAnimation *)operator_new(0x448);
        aiAnimation::aiAnimation(this_02);
        *(aiAnimation **)it._M_current = this_02;
        local_1f0 = this_02;
        it._M_current = it._M_current + 2;
        local_1f8._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)frames);
        uVar16 = __gnu_cxx::operator-(&local_1d0,&local_1f8);
        puVar17 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&local_1d0);
        uVar1 = *puVar17;
        nd = (aiNodeAnim *)
             __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator+(&local_1d0,1);
        puVar17 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)&nd);
        aVar7 = snprintf((this_02->mName).data,0x400,"anim%u_from_%u_to_%u",uVar16 & 0xffffffff,
                         (ulong)uVar1,(ulong)*puVar17);
        (local_1f0->mName).length = aVar7;
        local_1f0->mTicksPerSecond = (double)(float)local_f8._0_4_;
        local_1f0->mNumChannels = 1;
        ppaVar18 = (aiNodeAnim **)operator_new__(8);
        local_1f0->mChannels = ppaVar18;
        this_03 = (aiNodeAnim *)operator_new(0x438);
        aiNodeAnim::aiNodeAnim(this_03);
        *local_1f0->mChannels = this_03;
        local_208 = this_03;
        aiString::Set((aiString *)this_03,"<MD5Camera>");
        _Stack_210 = __gnu_cxx::
                     __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     ::operator+(&local_1d0,1);
        puVar17 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&stack0xfffffffffffffdf0);
        uVar1 = *puVar17;
        puVar17 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&local_1d0);
        uVar2 = *puVar17;
        local_208->mNumRotationKeys = uVar1 - uVar2;
        local_208->mNumPositionKeys = uVar1 - uVar2;
        uVar16 = (ulong)local_208->mNumPositionKeys;
        paVar19 = (aiVectorKey *)operator_new__(uVar16 * 0x18);
        if (uVar16 != 0) {
          local_318 = paVar19;
          do {
            aiVectorKey::aiVectorKey(local_318);
            local_318 = local_318 + 1;
          } while (local_318 != paVar19 + uVar16);
        }
        local_208->mPositionKeys = paVar19;
        uVar16 = (ulong)local_208->mNumRotationKeys;
        paVar20 = (aiQuatKey *)operator_new__(uVar16 * 0x18);
        if (uVar16 != 0) {
          local_340 = paVar20;
          do {
            aiQuatKey::aiQuatKey(local_340);
            local_340 = local_340 + 1;
          } while (local_340 != paVar20 + uVar16);
        }
        local_208->mRotationKeys = paVar20;
        for (local_214 = 0; paVar10 = root, local_214 < local_208->mNumPositionKeys;
            local_214 = local_214 + 1) {
          puVar17 = __gnu_cxx::
                    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator*(&local_1d0);
          pvVar13 = std::
                    vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                    ::operator[]((vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                                  *)paVar10,(ulong)(*puVar17 + local_214));
          paVar10 = root;
          paVar19 = local_208->mPositionKeys;
          paVar19[local_214].mValue.z = (pvVar13->super_BaseFrameDesc).vPositionXYZ.z;
          fVar3 = (pvVar13->super_BaseFrameDesc).vPositionXYZ.y;
          paVar19 = paVar19 + local_214;
          (paVar19->mValue).x = (pvVar13->super_BaseFrameDesc).vPositionXYZ.x;
          (paVar19->mValue).y = fVar3;
          puVar17 = __gnu_cxx::
                    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator*(&local_1d0);
          pvVar13 = std::
                    vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                    ::operator[]((vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                                  *)paVar10,(ulong)(*puVar17 + local_214));
          MD5::ConvertQuaternion
                    (&(pvVar13->super_BaseFrameDesc).vRotationQuat,
                     &local_208->mRotationKeys[local_214].mValue);
          puVar17 = __gnu_cxx::
                    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator*(&local_1d0);
          uVar1 = *puVar17;
          local_208->mPositionKeys[local_214].mTime = (double)(uVar1 + local_214);
          local_208->mRotationKeys[local_214].mTime = (double)(uVar1 + local_214);
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&local_1d0);
      }
      MD5::MD5CameraParser::~MD5CameraParser((MD5CameraParser *)local_f8);
      MD5::MD5Parser::~MD5Parser
                ((MD5Parser *)
                 &cameraParser.frames.
                  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                (&local_38);
      std::__cxx11::string::~string((string *)&file);
      return;
    }
  }
  pDVar9 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_90,"Failed to read MD5CAMERA file: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
  DeadlyImportError::DeadlyImportError(pDVar9,&local_90);
  __cxa_throw(pDVar9,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void MD5Importer::LoadMD5CameraFile ()
{
    std::string pFile = mFile + "md5camera";
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( !file.get() || !file->FileSize())   {
        throw DeadlyImportError("Failed to read MD5CAMERA file: " + pFile);
    }
    bHadMD5Camera = true;
    LoadFileIntoMemory(file.get());

    // parse the basic file structure
    MD5::MD5Parser parser(mBuffer,fileSize);

    // load the camera animation data from the parse tree
    MD5::MD5CameraParser cameraParser(parser.mSections);

    if (cameraParser.frames.empty()) {
        throw DeadlyImportError("MD5CAMERA: No frames parsed");
    }

    std::vector<unsigned int>& cuts = cameraParser.cuts;
    std::vector<MD5::CameraAnimFrameDesc>& frames = cameraParser.frames;

    // Construct output graph - a simple root with a dummy child.
    // The root node performs the coordinate system conversion
    aiNode* root = pScene->mRootNode = new aiNode("<MD5CameraRoot>");
    root->mChildren = new aiNode*[root->mNumChildren = 1];
    root->mChildren[0] = new aiNode("<MD5Camera>");
    root->mChildren[0]->mParent = root;

    // ... but with one camera assigned to it
    pScene->mCameras = new aiCamera*[pScene->mNumCameras = 1];
    aiCamera* cam = pScene->mCameras[0] = new aiCamera();
    cam->mName = "<MD5Camera>";

    // FIXME: Fov is currently set to the first frame's value
    cam->mHorizontalFOV = AI_DEG_TO_RAD( frames.front().fFOV );

    // every cut is written to a separate aiAnimation
    if (!cuts.size()) {
        cuts.push_back(0);
        cuts.push_back(static_cast<unsigned int>(frames.size()-1));
    }
    else {
        cuts.insert(cuts.begin(),0);

        if (cuts.back() < frames.size()-1)
            cuts.push_back(static_cast<unsigned int>(frames.size()-1));
    }

    pScene->mNumAnimations = static_cast<unsigned int>(cuts.size()-1);
    aiAnimation** tmp = pScene->mAnimations = new aiAnimation*[pScene->mNumAnimations];
    for (std::vector<unsigned int>::const_iterator it = cuts.begin(); it != cuts.end()-1; ++it) {

        aiAnimation* anim = *tmp++ = new aiAnimation();
        anim->mName.length = ::ai_snprintf(anim->mName.data, MAXLEN, "anim%u_from_%u_to_%u",(unsigned int)(it-cuts.begin()),(*it),*(it+1));

        anim->mTicksPerSecond = cameraParser.fFrameRate;
        anim->mChannels = new aiNodeAnim*[anim->mNumChannels = 1];
        aiNodeAnim* nd  = anim->mChannels[0] = new aiNodeAnim();
        nd->mNodeName.Set("<MD5Camera>");

        nd->mNumPositionKeys = nd->mNumRotationKeys = *(it+1) - (*it);
        nd->mPositionKeys = new aiVectorKey[nd->mNumPositionKeys];
        nd->mRotationKeys = new aiQuatKey  [nd->mNumRotationKeys];
        for (unsigned int i = 0; i < nd->mNumPositionKeys; ++i) {

            nd->mPositionKeys[i].mValue = frames[*it+i].vPositionXYZ;
            MD5::ConvertQuaternion(frames[*it+i].vRotationQuat,nd->mRotationKeys[i].mValue);
            nd->mRotationKeys[i].mTime = nd->mPositionKeys[i].mTime = *it+i;
        }
    }
}